

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ArbitrarySymbolExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference_const*&,slang::SourceRange&>
          (BumpAllocator *this,Scope *args,Symbol *args_1,Type *args_2,
          HierarchicalReference **args_3,SourceRange *args_4)

{
  ArbitrarySymbolExpression *this_00;
  
  this_00 = (ArbitrarySymbolExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ArbitrarySymbolExpression *)this->endPtr < this_00 + 1) {
    this_00 = (ArbitrarySymbolExpression *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::ArbitrarySymbolExpression::ArbitrarySymbolExpression
            (this_00,args,args_1,args_2,*args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }